

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorsTests.cpp
# Opt level: O0

void __thiscall
VectorsTest_Int3QuotientScalarAssignment_Test::TestBody
          (VectorsTest_Int3QuotientScalarAssignment_Test *this)

{
  bool bVar1;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Int3 v1;
  AssertHelper *in_stack_fffffffffffffee0;
  AssertHelper *this_00;
  int *in_stack_fffffffffffffee8;
  AssertionResult *pAVar2;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  undefined1 uVar3;
  char *in_stack_fffffffffffffef8;
  int line;
  char *in_stack_ffffffffffffff00;
  char *file;
  undefined8 in_stack_ffffffffffffff08;
  Type TVar4;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  undefined1 uVar5;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 uVar6;
  AssertHelper *in_stack_ffffffffffffff40;
  Vector3<int> local_ac;
  AssertionResult local_a0 [2];
  Vector3<int> local_7c;
  AssertionResult local_70;
  uint local_5c;
  Vector3<int> local_34;
  AssertionResult local_28;
  undefined1 local_14 [20];
  
  TVar4 = (Type)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  pica::Vector3<int>::Vector3((Vector3<int> *)local_14,0xd,0x19,0x15);
  pica::operator/=((Vector3<int> *)local_14,4);
  pica::Vector3<int>::Vector3(&local_34,3,6,5);
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_fffffffffffffef8,
             (char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
             in_stack_fffffffffffffee8,(int *)in_stack_fffffffffffffee0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  uVar6 = bVar1;
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    testing::AssertionResult::failure_message((AssertionResult *)0x1daf2e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),TVar4,
               in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff40,(Message *)CONCAT17(uVar6,in_stack_ffffffffffffff38));
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffee0);
    testing::Message::~Message((Message *)0x1daf8b);
  }
  local_5c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1daff9);
  if (local_5c == 0) {
    file = local_14 + 4;
    pica::Vector3<int>::Vector3(&local_7c,3,6,5);
    pAVar2 = &local_70;
    testing::internal::EqHelper<false>::Compare<int,int>
              (in_stack_fffffffffffffef8,
               (char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffee8,(int *)in_stack_fffffffffffffee0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar2);
    TVar4 = (Type)((ulong)pAVar2 >> 0x20);
    uVar5 = bVar1;
    if (!bVar1) {
      testing::Message::Message((Message *)CONCAT17(bVar1,in_stack_ffffffffffffff10));
      in_stack_fffffffffffffef8 =
           testing::AssertionResult::failure_message((AssertionResult *)0x1db0c7);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(uVar5,in_stack_ffffffffffffff10),TVar4,file,
                 (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff40,(Message *)CONCAT17(uVar6,in_stack_ffffffffffffff38));
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffee0);
      testing::Message::~Message((Message *)0x1db124);
    }
    local_5c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1db192);
    if (local_5c == 0) {
      this_00 = (AssertHelper *)(local_14 + 8);
      pica::Vector3<int>::Vector3(&local_ac,3,6,5);
      pAVar2 = local_a0;
      testing::internal::EqHelper<false>::Compare<int,int>
                (in_stack_fffffffffffffef8,
                 (char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),(int *)pAVar2
                 ,(int *)this_00);
      line = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar2);
      if (!bVar1) {
        uVar3 = bVar1;
        testing::Message::Message((Message *)CONCAT17(uVar5,in_stack_ffffffffffffff10));
        testing::AssertionResult::failure_message((AssertionResult *)0x1db25a);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(uVar5,in_stack_ffffffffffffff10),TVar4,file,line,
                   (char *)CONCAT17(uVar3,in_stack_fffffffffffffef0));
        testing::internal::AssertHelper::operator=
                  (in_stack_ffffffffffffff40,(Message *)CONCAT17(uVar6,in_stack_ffffffffffffff38));
        testing::internal::AssertHelper::~AssertHelper(this_00);
        testing::Message::~Message((Message *)0x1db2a6);
      }
      local_5c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1db30b);
    }
  }
  return;
}

Assistant:

TEST(VectorsTest, Int3QuotientScalarAssignment)
{
    Int3 v1(13, 25, 21);
    v1 /= 4;
    ASSERT_EQ_INT3(v1, Int3(3, 6, 5));
}